

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmNinjaNormalTargetGenerator.cxx
# Opt level: O1

char * __thiscall
cmNinjaNormalTargetGenerator::GetVisibleTypeName(cmNinjaNormalTargetGenerator *this)

{
  bool bVar1;
  TargetType TVar2;
  char *pcVar3;
  
  TVar2 = cmGeneratorTarget::GetType
                    ((this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.
                     GeneratorTarget);
  switch(TVar2) {
  case EXECUTABLE:
    pcVar3 = "executable";
    break;
  case STATIC_LIBRARY:
    pcVar3 = "static library";
    break;
  case SHARED_LIBRARY:
    pcVar3 = "shared library";
    break;
  case MODULE_LIBRARY:
    bVar1 = cmGeneratorTarget::IsCFBundleOnApple
                      ((this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.
                       GeneratorTarget);
    pcVar3 = "shared module";
    if (bVar1) {
      pcVar3 = "CFBundle shared module";
    }
    break;
  default:
    pcVar3 = (char *)0x0;
  }
  return pcVar3;
}

Assistant:

const char *cmNinjaNormalTargetGenerator::GetVisibleTypeName() const
{
  switch (this->GetGeneratorTarget()->GetType()) {
    case cmState::STATIC_LIBRARY:
      return "static library";
    case cmState::SHARED_LIBRARY:
      return "shared library";
    case cmState::MODULE_LIBRARY:
      if (this->GetGeneratorTarget()->IsCFBundleOnApple())
        return "CFBundle shared module";
      else
        return "shared module";
    case cmState::EXECUTABLE:
      return "executable";
    default:
      return 0;
  }
}